

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretMain.c
# Opt level: O3

void print_node(Abc_Obj_t *pObj)

{
  uint uVar1;
  void *pvVar2;
  size_t sVar3;
  ulong uVar4;
  long lVar5;
  char m [6];
  char local_26 [6];
  
  local_26[0] = '\0';
  uVar1 = *(uint *)&pObj->field_0x14;
  if ((uVar1 & 0x10) != 0) {
    sVar3 = strlen(local_26);
    (local_26 + sVar3)[0] = 'A';
    (local_26 + sVar3)[1] = '\0';
  }
  if ((uVar1 & 0x20) != 0) {
    sVar3 = strlen(local_26);
    (local_26 + sVar3)[0] = 'B';
    (local_26 + sVar3)[1] = '\0';
  }
  if ((uVar1 & 0x40) != 0) {
    sVar3 = strlen(local_26);
    (local_26 + sVar3)[0] = 'C';
    (local_26 + sVar3)[1] = '\0';
  }
  uVar4 = (ulong)(uint)pObj->Id;
  printf("node %d type=%d lev=%d tedge=%d (%x%s) fanouts {",uVar4,(ulong)(uVar1 & 0xf),
         (ulong)(uVar1 >> 0xc),(ulong)(uint)pManMR->vTimeEdges[uVar4].nSize,
         (ulong)*(ushort *)(pManMR->pDataArray + uVar4),local_26);
  if (0 < (pObj->vFanouts).nSize) {
    lVar5 = 0;
    do {
      pvVar2 = pObj->pNtk->vObjs->pArray[(pObj->vFanouts).pArray[lVar5]];
      uVar4 = (ulong)*(uint *)((long)pvVar2 + 0x10);
      printf("%d[%d](%d),",uVar4,(ulong)(*(uint *)((long)pvVar2 + 0x14) & 0xf),
             (ulong)*(ushort *)(pManMR->pDataArray + uVar4));
      lVar5 = lVar5 + 1;
    } while (lVar5 < (pObj->vFanouts).nSize);
  }
  printf("} fanins {");
  if (0 < (pObj->vFanins).nSize) {
    lVar5 = 0;
    do {
      pvVar2 = pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[lVar5]];
      uVar4 = (ulong)*(uint *)((long)pvVar2 + 0x10);
      printf("%d[%d](%d),",uVar4,(ulong)(*(uint *)((long)pvVar2 + 0x14) & 0xf),
             (ulong)*(ushort *)(pManMR->pDataArray + uVar4));
      lVar5 = lVar5 + 1;
    } while (lVar5 < (pObj->vFanins).nSize);
  }
  puts("}");
  return;
}

Assistant:

void
print_node(Abc_Obj_t *pObj) {
  int i;
  Abc_Obj_t * pNext;
  char m[6];

  m[0] = 0;
  if (pObj->fMarkA)
    strcat(m, "A");
  if (pObj->fMarkB)
    strcat(m, "B");
  if (pObj->fMarkC)
    strcat(m, "C");

  printf("node %d type=%d lev=%d tedge=%d (%x%s) fanouts {", Abc_ObjId(pObj), Abc_ObjType(pObj),
         pObj->Level, Vec_PtrSize(FTIMEEDGES(pObj)), FDATA(pObj)->mark, m);
  Abc_ObjForEachFanout( pObj, pNext, i )
    printf("%d[%d](%d),", Abc_ObjId(pNext), Abc_ObjType(pNext), FDATA(pNext)->mark);
  printf("} fanins {");
  Abc_ObjForEachFanin( pObj, pNext, i )
    printf("%d[%d](%d),", Abc_ObjId(pNext), Abc_ObjType(pNext), FDATA(pNext)->mark);
  printf("}\n");
}